

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void * __thiscall
Centaurus::SkipRoutineEM64T<wchar_t>::operator()(SkipRoutineEM64T<wchar_t> *this,void *input)

{
  void *pvVar1;
  code *local_40;
  _func_void_ptr_void_ptr *func;
  void *input_local;
  SkipRoutineEM64T<wchar_t> *this_local;
  code **local_20;
  JitRuntime *local_18;
  code **local_10;
  
  local_18 = &this->m_runtime;
  this_local = (SkipRoutineEM64T<wchar_t> *)&this->m_code;
  local_20 = &local_40;
  func = (_func_void_ptr_void_ptr *)input;
  input_local = this;
  local_10 = local_20;
  (*(local_18->super_HostRuntime).super_Runtime._vptr_Runtime[2])(local_18,local_20,this_local);
  pvVar1 = (void *)(*local_40)(func);
  return pvVar1;
}

Assistant:

virtual ~CharClass()
    {
    }